

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O0

void Llb_ManLabelLiCones_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  if ((*(ulong *)&pObj->field_0x18 >> 5 & 1) == 0) {
    *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xffffffffffffffdf | 0x20;
    iVar1 = Aig_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Pivot.c"
                    ,0x87,"void Llb_ManLabelLiCones_rec(Aig_Man_t *, Aig_Obj_t *)");
    }
    pAVar2 = Aig_ObjFanin0(pObj);
    Llb_ManLabelLiCones_rec(p,pAVar2);
    pAVar2 = Aig_ObjFanin1(pObj);
    Llb_ManLabelLiCones_rec(p,pAVar2);
  }
  return;
}

Assistant:

void Llb_ManLabelLiCones_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( pObj->fMarkB )
        return;
    pObj->fMarkB = 1;
    assert( Aig_ObjIsNode(pObj) );
    Llb_ManLabelLiCones_rec( p, Aig_ObjFanin0(pObj) );
    Llb_ManLabelLiCones_rec( p, Aig_ObjFanin1(pObj) );
}